

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

ostream * wasm::printStackIR(StackIR *ir,ostream *o,Function *func)

{
  uint uVar1;
  pointer ppSVar2;
  StackInst *pSVar3;
  char *pcVar4;
  Try *pTVar5;
  uint *puVar6;
  Name *pNVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  Name name;
  Name name_00;
  undefined1 local_a0 [8];
  SmallVector<unsigned_int,_4UL> catchIndexStack;
  undefined1 local_48 [8];
  anon_class_16_2_d966b294 doIndent;
  size_t indent;
  ostream *o_00;
  
  doIndent.indent = (size_t *)(ulong)((uint)(func != (Function *)0x0) * 2);
  doIndent.o = (ostream *)&doIndent.indent;
  local_a0 = (undefined1  [8])0x0;
  catchIndexStack.fixed._M_elems[2] = 0;
  catchIndexStack.fixed._M_elems[3] = 0;
  catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar9 = 0;
  iVar10 = 0;
  local_48 = (undefined1  [8])o;
  do {
    ppSVar2 = (ir->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(ir->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3) <=
        (ulong)uVar9) {
      if (iVar10 != 0) {
        __assert_fail("controlFlowDepth == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                      ,0xe98,
                      "std::ostream &wasm::printStackIR(StackIR *, std::ostream &, Function *)");
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                 (catchIndexStack.fixed._M_elems + 2));
      return o;
    }
    pSVar3 = ppSVar2[uVar9];
    if (pSVar3 == (StackInst *)0x0) goto LAB_00922b55;
    switch(pSVar3->op) {
    case Basic:
      printStackIR::anon_class_16_2_d966b294::operator()((anon_class_16_2_d966b294 *)local_48);
      if (pSVar3->origin->_id != PopId) {
        catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Visitor<wasm::PrintExpressionContents,_void>::visit
                  ((Visitor<wasm::PrintExpressionContents,_void> *)
                   &catchIndexStack.flexible.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,pSVar3->origin);
      }
      goto LAB_00922b4a;
    case IfElse:
      doIndent.indent = (size_t *)((long)doIndent.indent + -1);
      printStackIR::anon_class_16_2_d966b294::operator()((anon_class_16_2_d966b294 *)local_48);
      printMedium(o,"else");
      break;
    case TryBegin:
      catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)catchIndexStack.flexible.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
      SmallVector<unsigned_int,_4UL>::push_back
                ((SmallVector<unsigned_int,_4UL> *)local_a0,
                 (uint *)&catchIndexStack.flexible.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    case BlockBegin:
    case IfBegin:
    case LoopBegin:
      printStackIR::anon_class_16_2_d966b294::operator()((anon_class_16_2_d966b294 *)local_48);
      catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Visitor<wasm::PrintExpressionContents,_void>::visit
                ((Visitor<wasm::PrintExpressionContents,_void> *)
                 &catchIndexStack.flexible.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,pSVar3->origin);
      iVar10 = iVar10 + 1;
      break;
    case Catch:
      doIndent.indent = (size_t *)((long)doIndent.indent + -1);
      printStackIR::anon_class_16_2_d966b294::operator()((anon_class_16_2_d966b294 *)local_48);
      printMedium(o,"catch ");
      pTVar5 = Expression::cast<wasm::Try>(pSVar3->origin);
      puVar6 = SmallVector<unsigned_int,_4UL>::back((SmallVector<unsigned_int,_4UL> *)local_a0);
      uVar1 = *puVar6;
      uVar8 = uVar1 + 1;
      o_00 = (ostream *)(ulong)uVar8;
      *puVar6 = uVar8;
      pNVar7 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         (&(pTVar5->catchTags).
                           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,(ulong)uVar1);
      name_00.super_IString.str._M_str = (char *)o;
      name_00.super_IString.str._M_len = (size_t)(pNVar7->super_IString).str._M_str;
      anon_unknown_217::printName
                ((anon_unknown_217 *)(pNVar7->super_IString).str._M_len,name_00,o_00);
      break;
    case CatchAll:
      doIndent.indent = (size_t *)((long)doIndent.indent + -1);
      printStackIR::anon_class_16_2_d966b294::operator()((anon_class_16_2_d966b294 *)local_48);
      printMedium(o,"catch_all");
      break;
    case Delegate:
      doIndent.indent = (size_t *)((long)doIndent.indent + -1);
      printStackIR::anon_class_16_2_d966b294::operator()((anon_class_16_2_d966b294 *)local_48);
      printMedium(o,"delegate ");
      iVar10 = iVar10 + -1;
      pTVar5 = Expression::cast<wasm::Try>(pSVar3->origin);
      pcVar4 = (pTVar5->delegateTarget).super_IString.str._M_str;
      if (pcVar4 == DAT_00e63dc8) {
        std::ostream::operator<<(o,iVar10);
      }
      else {
        name.super_IString.str._M_str = (char *)o;
        name.super_IString.str._M_len = (size_t)pcVar4;
        anon_unknown_217::printName
                  ((anon_unknown_217 *)(pTVar5->delegateTarget).super_IString.str._M_len,name,
                   (ostream *)&DELEGATE_CALLER_TARGET);
      }
      goto LAB_00922b4a;
    case TryEnd:
      SmallVector<unsigned_int,_4UL>::pop_back((SmallVector<unsigned_int,_4UL> *)local_a0);
    case BlockEnd:
    case IfEnd:
    case LoopEnd:
      doIndent.indent = (size_t *)((long)doIndent.indent + -1);
      printStackIR::anon_class_16_2_d966b294::operator()((anon_class_16_2_d966b294 *)local_48);
      printMedium(o,"end");
      iVar10 = iVar10 + -1;
      goto LAB_00922b4a;
    default:
      handle_unreachable("unexpeted op",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                         ,0xe94);
    }
    doIndent.indent = (size_t *)((long)doIndent.indent + 1);
LAB_00922b4a:
    std::operator<<(o,'\n');
LAB_00922b55:
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

static std::ostream&
printStackIR(StackIR* ir, std::ostream& o, Function* func) {
  size_t indent = func ? 2 : 0;
  auto doIndent = [&]() { o << std::string(indent, ' '); };

  int controlFlowDepth = 0;
  // Stack to track indices of catches within a try
  SmallVector<Index, 4> catchIndexStack;
  for (Index i = 0; i < (*ir).size(); i++) {
    auto* inst = (*ir)[i];
    if (!inst) {
      continue;
    }
    switch (inst->op) {
      case StackInst::Basic: {
        doIndent();
        // Pop is a pseudo instruction and should not be printed in the stack IR
        // format to make it valid wat form.
        if (inst->origin->is<Pop>()) {
          break;
        }

        PrintExpressionContents(func, o).visit(inst->origin);
        break;
      }
      case StackInst::TryBegin:
        catchIndexStack.push_back(0);
        [[fallthrough]];
      case StackInst::BlockBegin:
      case StackInst::IfBegin:
      case StackInst::LoopBegin: {
        controlFlowDepth++;
        doIndent();
        PrintExpressionContents(func, o).visit(inst->origin);
        indent++;
        break;
      }
      case StackInst::TryEnd:
        catchIndexStack.pop_back();
        [[fallthrough]];
      case StackInst::BlockEnd:
      case StackInst::IfEnd:
      case StackInst::LoopEnd: {
        controlFlowDepth--;
        indent--;
        doIndent();
        printMedium(o, "end");
        break;
      }
      case StackInst::IfElse: {
        indent--;
        doIndent();
        printMedium(o, "else");
        indent++;
        break;
      }
      case StackInst::Catch: {
        indent--;
        doIndent();
        printMedium(o, "catch ");
        Try* curr = inst->origin->cast<Try>();
        printName(curr->catchTags[catchIndexStack.back()++], o);
        indent++;
        break;
      }
      case StackInst::CatchAll: {
        indent--;
        doIndent();
        printMedium(o, "catch_all");
        indent++;
        break;
      }
      case StackInst::Delegate: {
        controlFlowDepth--;
        indent--;
        doIndent();
        printMedium(o, "delegate ");
        Try* curr = inst->origin->cast<Try>();
        if (curr->delegateTarget == DELEGATE_CALLER_TARGET) {
          o << controlFlowDepth;
        } else {
          printName(curr->delegateTarget, o);
        }
        break;
      }
      default:
        WASM_UNREACHABLE("unexpeted op");
    }
    o << '\n';
  }
  assert(controlFlowDepth == 0);
  return o;
}